

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.h
# Opt level: O1

void __thiscall
xmrig::BaseTransform::set<long>(BaseTransform *this,Document *doc,char *objKey,char *key,long value)

{
  size_t sVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar2;
  uint16_t uVar3;
  Data local_58;
  Data local_48;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)doc);
  if (local_58.n.i64 ==
      (Number)((ulong)(doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.s.length * 0x20 +
              ((ulong)(doc->
                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ).data_.s.str & 0xffffffffffff))) {
    sVar1 = strlen(objKey);
    local_48.s.str = (Ch *)((ulong)objKey | 0x405000000000000);
    local_48.n = (Number)(sVar1 & 0xffffffff);
    local_58.n.i64 = (Number)0x0;
    local_58.s.str = (Ch *)0x3000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_48.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_58.s,doc->allocator_);
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)doc,objKey);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_58.s,(Ch *)this_00);
  if (local_58.n.i64 ==
      (Number)((ulong)*(uint *)this_00 * 0x20 + (*(ulong *)(this_00 + 8) & 0xffffffffffff))) {
    sVar1 = strlen(key);
    local_58.s.str = (Ch *)((ulong)key | 0x405000000000000);
    local_58.n = (Number)(sVar1 & 0xffffffff);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)this_00,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_58.s,value,doc->allocator_);
  }
  else {
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,key);
    if (value < 0) {
      uVar3 = (ushort)(-0x80000001 < value) << 5 | 0x96;
    }
    else {
      uVar3 = (ushort)((ulong)value >> 0x20 == 0) * 0x40 +
              (ushort)((value & 0xffffffff80000000U) == 0) * 0x20 + 0x196;
    }
    (pGVar2->data_).n = (Number)value;
    *(undefined4 *)((long)&pGVar2->data_ + 8) = 0;
    *(undefined2 *)((long)&pGVar2->data_ + 0xc) = 0;
    (pGVar2->data_).f.flags = uVar3;
  }
  return;
}

Assistant:

inline void set(rapidjson::Document &doc, const char *objKey, const char *key, T value)
    {
        if (!doc.HasMember(objKey)) {
            doc.AddMember(rapidjson::StringRef(objKey), rapidjson::kObjectType, doc.GetAllocator());
        }

        set<T>(doc, doc[objKey], key, value);
    }